

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtabwidget.cpp
# Opt level: O2

void QTabWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QSize *pQVar1;
  bool bVar2;
  TextElideMode TVar3;
  undefined8 *puVar4;
  QSize QVar5;
  int index;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      currentChanged((QTabWidget *)_o,*_a[1]);
      return;
    case 1:
      tabCloseRequested((QTabWidget *)_o,*_a[1]);
      return;
    case 2:
      tabBarClicked((QTabWidget *)_o,*_a[1]);
      return;
    case 3:
      tabBarDoubleClicked((QTabWidget *)_o,*_a[1]);
      return;
    case 4:
      index = *_a[1];
      break;
    case 5:
      setCurrentWidget((QTabWidget *)_o,*_a[1]);
      return;
    default:
      return;
    }
    goto LAB_0046aff4;
  case ReadProperty:
    if (10 < (uint)_id) {
      return;
    }
    break;
  case WriteProperty:
    if (10 < (uint)_id) {
      return;
    }
    pQVar1 = (QSize *)*_a;
    switch(_id) {
    case 0:
      setTabPosition((QTabWidget *)_o,(pQVar1->wd).m_i);
      return;
    case 1:
      setTabShape((QTabWidget *)_o,(pQVar1->wd).m_i);
      return;
    case 2:
      index = (pQVar1->wd).m_i;
      break;
    case 3:
      return;
    case 4:
      setIconSize((QTabWidget *)_o,pQVar1);
      return;
    case 5:
      setElideMode((QTabWidget *)_o,(pQVar1->wd).m_i);
      return;
    case 6:
      setUsesScrollButtons((QTabWidget *)_o,SUB41((pQVar1->wd).m_i,0));
      return;
    case 7:
      setDocumentMode((QTabWidget *)_o,SUB41((pQVar1->wd).m_i,0));
      return;
    case 8:
      setTabsClosable((QTabWidget *)_o,SUB41((pQVar1->wd).m_i,0));
      return;
    case 9:
      setMovable((QTabWidget *)_o,SUB41((pQVar1->wd).m_i,0));
      return;
    case 10:
      setTabBarAutoHide((QTabWidget *)_o,SUB41((pQVar1->wd).m_i,0));
      return;
    }
LAB_0046aff4:
    setCurrentIndex((QTabWidget *)_o,index);
    return;
  default:
    goto switchD_0046aea5_caseD_3;
  case IndexOfMethod:
    bVar2 = QtMocHelpers::indexOfMethod<void(QTabWidget::*)(int)>
                      ((QtMocHelpers *)_a,(void **)currentChanged,0,0);
    if (bVar2) {
      return;
    }
    bVar2 = QtMocHelpers::indexOfMethod<void(QTabWidget::*)(int)>
                      ((QtMocHelpers *)_a,(void **)tabCloseRequested,0,1);
    if (bVar2) {
      return;
    }
    bVar2 = QtMocHelpers::indexOfMethod<void(QTabWidget::*)(int)>
                      ((QtMocHelpers *)_a,(void **)tabBarClicked,0,2);
    if (bVar2) {
      return;
    }
    QtMocHelpers::indexOfMethod<void(QTabWidget::*)(int)>
              ((QtMocHelpers *)_a,(void **)tabBarDoubleClicked,0,3);
    return;
  case RegisterMethodArgumentMetaType:
    if (_id == 5) {
      puVar4 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        *puVar4 = &QtPrivate::QMetaTypeInterfaceWrapper<QWidget_*>::metaType;
        return;
      }
    }
    else {
      puVar4 = (undefined8 *)*_a;
    }
    *puVar4 = 0;
    goto switchD_0046aea5_caseD_3;
  }
  pQVar1 = (QSize *)*_a;
  switch(_id) {
  case 0:
    TVar3 = *(TextElideMode *)(*(long *)(_o + 8) + 0x27c);
    break;
  case 1:
    TVar3 = *(TextElideMode *)(*(long *)(_o + 8) + 0x280);
    break;
  case 2:
    TVar3 = currentIndex((QTabWidget *)_o);
    break;
  case 3:
    TVar3 = count((QTabWidget *)_o);
    break;
  case 4:
    QVar5 = iconSize((QTabWidget *)_o);
    *pQVar1 = QVar5;
    return;
  case 5:
    TVar3 = elideMode((QTabWidget *)_o);
    break;
  case 6:
    bVar2 = usesScrollButtons((QTabWidget *)_o);
    goto LAB_0046b08b;
  case 7:
    bVar2 = documentMode((QTabWidget *)_o);
    goto LAB_0046b08b;
  case 8:
    bVar2 = tabsClosable((QTabWidget *)_o);
    goto LAB_0046b08b;
  case 9:
    bVar2 = isMovable((QTabWidget *)_o);
    goto LAB_0046b08b;
  case 10:
    bVar2 = tabBarAutoHide((QTabWidget *)_o);
LAB_0046b08b:
    *(bool *)&(pQVar1->wd).m_i = bVar2;
    return;
  }
  (pQVar1->wd).m_i = TVar3;
switchD_0046aea5_caseD_3:
  return;
}

Assistant:

void QTabWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTabWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->currentChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->tabCloseRequested((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->tabBarClicked((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->tabBarDoubleClicked((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: _t->setCurrentWidget((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 5:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTabWidget::*)(int )>(_a, &QTabWidget::currentChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTabWidget::*)(int )>(_a, &QTabWidget::tabCloseRequested, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTabWidget::*)(int )>(_a, &QTabWidget::tabBarClicked, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTabWidget::*)(int )>(_a, &QTabWidget::tabBarDoubleClicked, 3))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<TabPosition*>(_v) = _t->tabPosition(); break;
        case 1: *reinterpret_cast<TabShape*>(_v) = _t->tabShape(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->currentIndex(); break;
        case 3: *reinterpret_cast<int*>(_v) = _t->count(); break;
        case 4: *reinterpret_cast<QSize*>(_v) = _t->iconSize(); break;
        case 5: *reinterpret_cast<Qt::TextElideMode*>(_v) = _t->elideMode(); break;
        case 6: *reinterpret_cast<bool*>(_v) = _t->usesScrollButtons(); break;
        case 7: *reinterpret_cast<bool*>(_v) = _t->documentMode(); break;
        case 8: *reinterpret_cast<bool*>(_v) = _t->tabsClosable(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->isMovable(); break;
        case 10: *reinterpret_cast<bool*>(_v) = _t->tabBarAutoHide(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setTabPosition(*reinterpret_cast<TabPosition*>(_v)); break;
        case 1: _t->setTabShape(*reinterpret_cast<TabShape*>(_v)); break;
        case 2: _t->setCurrentIndex(*reinterpret_cast<int*>(_v)); break;
        case 4: _t->setIconSize(*reinterpret_cast<QSize*>(_v)); break;
        case 5: _t->setElideMode(*reinterpret_cast<Qt::TextElideMode*>(_v)); break;
        case 6: _t->setUsesScrollButtons(*reinterpret_cast<bool*>(_v)); break;
        case 7: _t->setDocumentMode(*reinterpret_cast<bool*>(_v)); break;
        case 8: _t->setTabsClosable(*reinterpret_cast<bool*>(_v)); break;
        case 9: _t->setMovable(*reinterpret_cast<bool*>(_v)); break;
        case 10: _t->setTabBarAutoHide(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}